

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

int op_mem_seek(void *_stream,opus_int64 _offset,int _whence)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  
  lVar1 = *(long *)((long)_stream + 0x10);
  if (_whence == 2) {
    lVar1 = *(long *)((long)_stream + 8);
    lVar4 = -_offset;
    bVar3 = -lVar1 < _offset;
    bVar2 = _offset <= 0x7fffffffffffffff - lVar1;
    _offset = lVar1 + _offset;
    if (bVar2 && (lVar4 == lVar1 || bVar3)) goto LAB_0010e146;
  }
  else if (_whence == 1) {
    if (_offset <= 0x7fffffffffffffff - lVar1 && (-_offset == lVar1 || -lVar1 < _offset)) {
      _offset = _offset + lVar1;
      goto LAB_0010e146;
    }
  }
  else if ((_whence == 0) && (-1 < _offset)) {
LAB_0010e146:
    *(opus_int64 *)((long)_stream + 0x10) = _offset;
    return 0;
  }
  return -1;
}

Assistant:

static int op_mem_seek(void *_stream,opus_int64 _offset,int _whence){
  OpusMemStream *stream;
  ptrdiff_t      pos;
  stream=(OpusMemStream *)_stream;
  pos=stream->pos;
  OP_ASSERT(pos>=0);
  switch(_whence){
    case SEEK_SET:{
      /*Check for overflow:*/
      if(_offset<0||_offset>OP_MEM_DIFF_MAX)return -1;
      pos=(ptrdiff_t)_offset;
    }break;
    case SEEK_CUR:{
      /*Check for overflow:*/
      if(_offset<-pos||_offset>OP_MEM_DIFF_MAX-pos)return -1;
      pos=(ptrdiff_t)(pos+_offset);
    }break;
    case SEEK_END:{
      ptrdiff_t size;
      size=stream->size;
      OP_ASSERT(size>=0);
      /*Check for overflow:*/
      if(_offset<-size||_offset>OP_MEM_DIFF_MAX-size)return -1;
      pos=(ptrdiff_t)(size+_offset);
    }break;
    default:return -1;
  }
  stream->pos=pos;
  return 0;
}